

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O1

int Abc_NtkCheckSingleInstance(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  void *pvVar2;
  Abc_Obj_t *pObj;
  void *pvVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    iVar11 = 1;
  }
  else {
    pVVar7 = pNtk->pDesign->vModules;
    lVar5 = (long)pVVar7->nSize;
    if (0 < lVar5) {
      ppvVar1 = pVVar7->pArray;
      lVar9 = 0;
      do {
        *(undefined4 *)((long)ppvVar1[lVar9] + 0xc0) = 0;
        lVar9 = lVar9 + 1;
      } while (lVar5 != lVar9);
    }
    pVVar7 = pNtk->pDesign->vModules;
    uVar8 = (ulong)(uint)pVVar7->nSize;
    iVar11 = 1;
    if (0 < pVVar7->nSize) {
      lVar5 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar5];
        lVar9 = *(long *)((long)pvVar2 + 0x50);
        if (0 < *(int *)(lVar9 + 4)) {
          lVar12 = 0;
          do {
            pObj = *(Abc_Obj_t **)(*(long *)(lVar9 + 8) + lVar12 * 8);
            pvVar3 = (pObj->field_5).pData;
            if (pvVar3 != (void *)0x0) {
              if (0 < *(int *)((long)pvVar3 + 0x80)) {
                iVar11 = 0;
                printf("Network \"%s\" contains %d flops.\n",pNtk->pName);
              }
              if (*(int *)((long)pvVar3 + 0xc0) != 0) {
                pcVar4 = pNtk->pName;
                pcVar6 = Abc_ObjName(pObj);
                iVar11 = 0;
                printf("Network \"%s\" contains box \"%s\" whose model \"%s\" is instantiated more than once.\n"
                       ,pcVar4,pcVar6,*(undefined8 *)((long)pvVar3 + 8));
              }
              *(undefined4 *)((long)pvVar3 + 0xc0) = 1;
            }
            lVar12 = lVar12 + 1;
            lVar9 = *(long *)((long)pvVar2 + 0x50);
          } while (lVar12 < *(int *)(lVar9 + 4));
        }
        lVar5 = lVar5 + 1;
        pVVar7 = pNtk->pDesign->vModules;
        uVar8 = (ulong)pVVar7->nSize;
      } while (lVar5 < (long)uVar8);
    }
    if (0 < (int)uVar8) {
      ppvVar1 = pVVar7->pArray;
      uVar10 = 0;
      do {
        *(undefined4 *)((long)ppvVar1[uVar10] + 0xc0) = 0;
        uVar10 = uVar10 + 1;
      } while ((uVar8 & 0xffffffff) != uVar10);
    }
  }
  return iVar11;
}

Assistant:

int Abc_NtkCheckSingleInstance( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pTemp, * pModel;
    Abc_Obj_t * pBox;
    int i, k, RetValue = 1;
    if ( pNtk->pDesign == NULL )
        return 1;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        pTemp->fHieVisited = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pBox, k )
        {
            pModel = (Abc_Ntk_t *)pBox->pData;
            if ( pModel == NULL )
                continue;
            if ( Abc_NtkLatchNum(pModel) > 0 )
            {
                printf( "Network \"%s\" contains %d flops.\n",                     
                    Abc_NtkName(pNtk), Abc_NtkLatchNum(pModel) );
                RetValue = 0;
            }
            if ( pModel->fHieVisited )
            {
                printf( "Network \"%s\" contains box \"%s\" whose model \"%s\" is instantiated more than once.\n", 
                    Abc_NtkName(pNtk), Abc_ObjName(pBox), Abc_NtkName(pModel) );
                RetValue = 0;
            }
            pModel->fHieVisited = 1;
        }